

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

void __thiscall CodeGenerator::writeIncludes(CodeGenerator *this,ostream *s,Class *clazz)

{
  bool bVar1;
  reference ppVar2;
  vector<Replicator,_std::allocator<Replicator>_> *this_00;
  reference pRVar3;
  pointer ppVar4;
  ulong uVar5;
  reference pbVar6;
  ostream *poVar7;
  string local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i_1;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Class *local_1c8;
  Class *c_1;
  _Self local_1b8;
  iterator classIt;
  Replicator replicator;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Replicator,_std::allocator<Replicator>_> *__range1_1;
  Class *c;
  undefined1 local_90 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  i;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Class *clazz_local;
  ostream *s_local;
  CodeGenerator *this_local;
  
  includes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)clazz;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
           ::begin(&this->m_classes);
  i.second = (Class *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                      ::end(&this->m_classes);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i.second), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
            *)local_90,ppVar2);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,(value_type *)(i.first.field_2._8_8_ + 0x20));
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
             *)local_90);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
    ::operator++(&__end1);
  }
  this_00 = (vector<Replicator,_std::allocator<Replicator>_> *)
            (includes._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xc0);
  __end1_1 = std::vector<Replicator,_std::allocator<Replicator>_>::begin(this_00);
  replicator.terminator.field_2._8_8_ =
       std::vector<Replicator,_std::allocator<Replicator>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
                             *)((long)&replicator.terminator.field_2 + 8)), bVar1) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>
             ::operator*(&__end1_1);
    Replicator::Replicator((Replicator *)&classIt,pRVar3);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
         ::find(&this->m_classes,(key_type *)((long)&replicator.id.field_2 + 8));
    c_1 = (Class *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                   ::end(&this->m_classes);
    bVar1 = std::operator!=(&local_1b8,(_Self *)&c_1);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
               ::operator->(&local_1b8);
      local_1c8 = ppVar4->second;
      if ((local_1c8->declarationOnly & 1U) == 0) {
        std::operator+(&local_208,"generated_",&local_1c8->name);
        std::operator+(&local_1e8,&local_208,".h");
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
      }
      else {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,&local_1c8->include);
        }
      }
    }
    Replicator::~Replicator((Replicator *)&classIt);
    __gnu_cxx::
    __normal_iterator<Replicator_*,_std::vector<Replicator,_std::allocator<Replicator>_>_>::
    operator++(&__end1_1);
  }
  __end1_2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  i_1.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
  while (bVar1 = std::operator!=(&__end1_2,(_Self *)((long)&i_1.field_2 + 8)), bVar1) {
    pbVar6 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_2);
    std::__cxx11::string::string(local_260,(string *)pbVar6);
    poVar7 = std::operator<<(s,"#include \"");
    poVar7 = std::operator<<(poVar7,local_260);
    poVar7 = std::operator<<(poVar7,"\"");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_260);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void CodeGenerator::writeIncludes(std::ostream &s, Class *clazz)
{
    std::set<std::string> includes;

    // First add all imported classes' includes.
    for (auto i : m_classes) {
        const Class *c = i.second;
        if (!c->include.empty())
            includes.insert(i.second->include);
    }
    // Then include all includes to classes we're replecating..
    // ### We should be checking for cyclic deps here..
    for (auto replicator : clazz->replicators) {
        auto classIt = m_classes.find(replicator.clazz);
        if (classIt != m_classes.end()) {
            Class *c = classIt->second;
            if (!c->declarationOnly) {
                // a generated class,
                includes.insert("generated_" + c->name + ".h");
            } else if (!c->include.empty()) {
                includes.insert(c->include);
            }
        }
    }

    for (auto i : includes)
        s << "#include \"" << i << "\"" << std::endl;
    s << std::endl;
}